

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

SymID __thiscall IRBuilder::BuildSrcStackSymID(IRBuilder *this,RegSlot regSlot)

{
  BVFixed *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_01;
  SymID local_18;
  SymID symID;
  RegSlot regSlot_local;
  IRBuilder *this_local;
  
  BVar4 = RegIsTemp(this,regSlot);
  local_18 = regSlot;
  if (BVar4 == 0) {
    bVar2 = IsLoopBody(this);
    if ((bVar2) && (BVar4 = RegIsConstant(this,regSlot), BVar4 == 0)) {
      EnsureLoopBodyLoadSlot(this,regSlot,false);
    }
  }
  else {
    local_18 = GetMappedTemp(this,regSlot);
    if (local_18 == 0) {
      bVar2 = IsLoopBody(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x4c8,"(this->IsLoopBody())","this->IsLoopBody()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = this->m_usedAsTemp;
      this_01 = Func::GetJITFunctionBody(this->m_func);
      RVar5 = JITTimeFunctionBody::GetFirstTmpReg(this_01);
      BVar3 = BVFixed::Test(this_00,regSlot - RVar5);
      if (BVar3 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x4c9,
                           "(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()))"
                           ,
                           "!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg())"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      SetMappedTemp(this,regSlot,regSlot);
      EnsureLoopBodyLoadSlot(this,regSlot,false);
      local_18 = regSlot;
    }
  }
  return local_18;
}

Assistant:

SymID
IRBuilder::BuildSrcStackSymID(Js::RegSlot regSlot)
{
    SymID symID;

    if (this->RegIsTemp(regSlot))
    {
        // This is a use of a temp. Map the reg slot to its sym ID.
        //     !!!NOTE: always process an instruction's temp uses before its temp defs!!!
        symID = this->GetMappedTemp(regSlot);
        if (symID == 0)
        {
            // We might have temps that are live through the loop body via "with" statement
            // We need to treat those as if they are locals and don't remap them
            Assert(this->IsLoopBody());
            Assert(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()));

            symID = static_cast<SymID>(regSlot);
            this->SetMappedTemp(regSlot, symID);
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    else
    {
        symID = static_cast<SymID>(regSlot);
        if (IsLoopBody() && !this->RegIsConstant(regSlot))
        {
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    return symID;
}